

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crit.hpp
# Opt level: O0

double find_split_full_gain<float,long_double>
                 (float *x,size_t st,size_t end,size_t *ix_arr,size_t *cols_use,size_t ncols_use,
                 bool force_cols_use,double *X_row_major,size_t ncols,double *Xr,size_t *Xr_ind,
                 size_t *Xr_indptr,double *buffer_sum_left,double *buffer_sum_tot,size_t *split_ix,
                 double *split_point,bool x_uses_ix_arr)

{
  float *pfVar1;
  byte bVar2;
  long lVar3;
  long lVar4;
  ulong *puVar5;
  difference_type dVar6;
  long in_RCX;
  ulong in_RDX;
  ulong in_RSI;
  long in_RDI;
  ulong *in_R8;
  unsigned_long *in_R9;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  byte in_stack_00000008;
  long in_stack_00000010;
  unsigned_long *in_stack_00000018;
  long in_stack_00000020;
  long in_stack_00000028;
  long in_stack_00000030;
  double *in_stack_00000038;
  double *in_stack_00000040;
  ulong *in_stack_00000048;
  double *in_stack_00000050;
  byte in_stack_00000058;
  size_t col_5;
  size_t row_7;
  size_t *cols_end_1;
  double *Xr_this_1;
  size_t *curr_col_1;
  size_t *row_end_1;
  size_t *curr_begin_1;
  size_t col_4;
  size_t row_6;
  size_t ptr_this_1;
  size_t col_3;
  size_t col_2;
  size_t row_5;
  double *ptr_row_1;
  size_t col_1;
  size_t row_4;
  double vright;
  double vleft;
  double dr;
  double dl;
  double sr;
  double sl;
  double this_gain;
  double best_gain;
  size_t row_3;
  size_t ptr_this;
  size_t row_2;
  size_t *cols_end;
  double *Xr_this;
  size_t *curr_col;
  size_t *row_end;
  size_t *curr_begin;
  size_t row_1;
  size_t col;
  size_t row;
  double *ptr_row;
  long in_stack_fffffffffffffe18;
  float fVar18;
  double *in_stack_fffffffffffffe28;
  undefined7 in_stack_fffffffffffffe30;
  undefined1 in_stack_fffffffffffffe37;
  undefined1 uVar19;
  unsigned_long *in_stack_fffffffffffffe38;
  unsigned_long *__last;
  unsigned_long *in_stack_fffffffffffffe40;
  double *__first;
  unsigned_long *local_198;
  unsigned_long *local_160;
  ulong local_158;
  ulong *local_140;
  ulong *local_130;
  unsigned_long *local_128;
  ulong local_120;
  unsigned_long *local_110;
  unsigned_long *local_108;
  ulong local_100;
  unsigned_long *local_f0;
  ulong local_e8;
  double local_e0;
  double local_d8;
  double local_a8;
  ulong local_a0;
  ulong local_90;
  ulong *local_78;
  ulong *local_68;
  ulong local_60;
  unsigned_long *local_58;
  ulong local_50;
  byte local_39;
  double local_8;
  
  local_39 = in_stack_00000008 & 1;
  bVar2 = in_stack_00000058 & 1;
  if (in_RSI < in_RDX) {
    if (((in_R8 != (ulong *)0x0) && (in_R9 != (unsigned_long *)0x0)) &&
       (auVar17._8_4_ = (int)((ulong)in_R9 >> 0x20), auVar17._0_8_ = in_R9,
       auVar17._12_4_ = 0x45300000, auVar8._8_4_ = (int)((ulong)in_stack_00000018 >> 0x20),
       auVar8._0_8_ = in_stack_00000018, auVar8._12_4_ = 0x45300000,
       ((auVar17._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)in_R9) - 4503599627370496.0)) /
       ((auVar8._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)in_stack_00000018) - 4503599627370496.0)) < 0.1)) {
      local_39 = 1;
    }
    local_198 = in_R9;
    if (local_39 == 0) {
      local_198 = in_stack_00000018;
    }
    memset(in_stack_00000040,0,(long)local_198 << 3);
    if (in_stack_00000030 == 0) {
      local_60 = in_RSI;
      local_50 = in_RSI;
      if (local_39 == 0) {
        for (; local_60 <= in_RDX; local_60 = local_60 + 1) {
          xpy1((double *)
               (in_stack_00000010 + *(long *)(in_RCX + local_60 * 8) * (long)in_stack_00000018 * 8),
               in_stack_00000040,(size_t)in_stack_00000018);
        }
      }
      else {
        for (; local_50 <= in_RDX; local_50 = local_50 + 1) {
          lVar3 = *(long *)(in_RCX + local_50 * 8);
          for (local_58 = (unsigned_long *)0x0; local_58 < in_R9;
              local_58 = (unsigned_long *)((long)local_58 + 1)) {
            in_stack_00000040[(long)local_58] =
                 *(double *)
                  (in_stack_00000010 + lVar3 * (long)in_stack_00000018 * 8 +
                  in_R8[(long)local_58] * 8) + in_stack_00000040[(long)local_58];
          }
        }
      }
    }
    else {
      local_a0 = in_RSI;
      if (local_39 == 0) {
        for (; local_a0 <= in_RDX; local_a0 = local_a0 + 1) {
          lVar3 = *(long *)(in_stack_00000030 + *(long *)(in_RCX + local_a0 * 8) * 8);
          xpy1((double *)(in_stack_00000020 + lVar3 * 8),(size_t *)(in_stack_00000028 + lVar3 * 8),
               *(long *)(in_stack_00000030 + 8 + *(long *)(in_RCX + local_a0 * 8) * 8) - lVar3,
               in_stack_00000040);
        }
      }
      else {
        for (local_90 = in_RSI; local_90 <= in_RDX; local_90 = local_90 + 1) {
          local_68 = (ulong *)(in_stack_00000028 +
                              *(long *)(in_stack_00000030 + *(long *)(in_RCX + local_90 * 8) * 8) *
                              8);
          puVar5 = (ulong *)(in_stack_00000028 +
                            *(long *)(in_stack_00000030 + 8 + *(long *)(in_RCX + local_90 * 8) * 8)
                            * 8);
          if (local_68 != puVar5) {
            lVar3 = *(long *)(in_stack_00000030 + *(long *)(in_RCX + local_90 * 8) * 8);
            local_78 = in_R8;
            while (local_78 < in_R8 + (long)in_R9 && local_68 < puVar5) {
              if (*local_68 == *local_78) {
                dVar6 = std::distance<unsigned_long*>
                                  ((unsigned_long *)
                                   CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30),
                                   (unsigned_long *)in_stack_fffffffffffffe28);
                dVar7 = *(double *)(in_stack_00000020 + lVar3 * 8 + dVar6 * 8);
                dVar6 = std::distance<unsigned_long*>
                                  ((unsigned_long *)
                                   CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30),
                                   (unsigned_long *)in_stack_fffffffffffffe28);
                in_stack_00000040[dVar6] = dVar7 + in_stack_00000040[dVar6];
                local_78 = local_78 + 1;
                local_68 = local_68 + 1;
              }
              else if (*local_78 < *local_68) {
                local_78 = std::lower_bound<unsigned_long*,unsigned_long>
                                     (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,
                                      (unsigned_long *)
                                      CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30))
                ;
              }
              else {
                local_68 = std::lower_bound<unsigned_long*,unsigned_long>
                                     (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,
                                      (unsigned_long *)
                                      CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30))
                ;
              }
            }
          }
        }
      }
    }
    local_a8 = -INFINITY;
    __last = in_stack_00000018;
    if (local_39 != 0) {
      __last = in_R9;
    }
    __first = in_stack_00000038;
    memset(in_stack_00000038,0,(long)__last << 3);
    if (in_stack_00000030 == 0) {
      local_100 = in_RSI;
      local_e8 = in_RSI;
      if (local_39 == 0) {
        for (; local_e8 < in_RDX; local_e8 = local_e8 + 1) {
          xpy1((double *)
               (in_stack_00000010 + *(long *)(in_RCX + local_e8 * 8) * (long)in_stack_00000018 * 8),
               in_stack_00000038,(size_t)in_stack_00000018);
          if (bVar2 == 0) {
            fVar18 = *(float *)(in_RDI + local_e8 * 4);
            pfVar1 = (float *)(in_RDI + 4 + local_e8 * 4);
            if ((fVar18 != *pfVar1) || (NAN(fVar18) || NAN(*pfVar1))) goto LAB_004c6c45;
          }
          else {
            fVar18 = *(float *)(in_RDI + *(long *)(in_RCX + local_e8 * 8) * 4);
            pfVar1 = (float *)(in_RDI + *(long *)(in_RCX + 8 + local_e8 * 8) * 4);
            if ((fVar18 != *pfVar1) || (NAN(fVar18) || NAN(*pfVar1))) {
LAB_004c6c45:
              local_d8 = 0.0;
              local_e0 = 0.0;
              lVar3 = (local_e8 - in_RSI) + 1;
              auVar9._8_4_ = (int)((ulong)lVar3 >> 0x20);
              auVar9._0_8_ = lVar3;
              auVar9._12_4_ = 0x45300000;
              lVar4 = in_RDX - local_e8;
              auVar10._8_4_ = (int)((ulong)lVar4 >> 0x20);
              auVar10._0_8_ = lVar4;
              auVar10._12_4_ = 0x45300000;
              for (local_f0 = (unsigned_long *)0x0; local_f0 < in_stack_00000018;
                  local_f0 = (unsigned_long *)((long)local_f0 + 1)) {
                dVar7 = in_stack_00000038[(long)local_f0];
                local_d8 = dVar7 * (dVar7 / ((auVar9._8_8_ - 1.9342813113834067e+25) +
                                            ((double)CONCAT44(0x43300000,(int)lVar3) -
                                            4503599627370496.0))) + local_d8;
                local_e0 = (in_stack_00000040[(long)local_f0] - dVar7) *
                           ((in_stack_00000040[(long)local_f0] - dVar7) /
                           ((auVar10._8_8_ - 1.9342813113834067e+25) +
                           ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0))) +
                           local_e0;
              }
              if (local_a8 < local_d8 + local_e0) {
                *in_stack_00000048 = local_e8;
                local_a8 = local_d8 + local_e0;
              }
            }
          }
        }
      }
      else {
        for (; local_100 < in_RDX; local_100 = local_100 + 1) {
          lVar3 = *(long *)(in_RCX + local_100 * 8);
          for (local_108 = (unsigned_long *)0x0; local_108 < in_R9;
              local_108 = (unsigned_long *)((long)local_108 + 1)) {
            in_stack_00000038[(long)local_108] =
                 *(double *)
                  (in_stack_00000010 + lVar3 * (long)in_stack_00000018 * 8 +
                  in_R8[(long)local_108] * 8) + in_stack_00000038[(long)local_108];
          }
          if (bVar2 == 0) {
            fVar18 = *(float *)(in_RDI + local_100 * 4);
            pfVar1 = (float *)(in_RDI + 4 + local_100 * 4);
            if ((fVar18 != *pfVar1) || (NAN(fVar18) || NAN(*pfVar1))) goto LAB_004c6f8a;
          }
          else {
            fVar18 = *(float *)(in_RDI + *(long *)(in_RCX + local_100 * 8) * 4);
            pfVar1 = (float *)(in_RDI + *(long *)(in_RCX + 8 + local_100 * 8) * 4);
            if ((fVar18 != *pfVar1) || (NAN(fVar18) || NAN(*pfVar1))) {
LAB_004c6f8a:
              local_d8 = 0.0;
              local_e0 = 0.0;
              lVar3 = (local_100 - in_RSI) + 1;
              auVar11._8_4_ = (int)((ulong)lVar3 >> 0x20);
              auVar11._0_8_ = lVar3;
              auVar11._12_4_ = 0x45300000;
              lVar4 = in_RDX - local_100;
              auVar12._8_4_ = (int)((ulong)lVar4 >> 0x20);
              auVar12._0_8_ = lVar4;
              auVar12._12_4_ = 0x45300000;
              for (local_110 = (unsigned_long *)0x0; local_110 < in_R9;
                  local_110 = (unsigned_long *)((long)local_110 + 1)) {
                dVar7 = in_stack_00000038[(long)local_110];
                local_d8 = dVar7 * (dVar7 / ((auVar11._8_8_ - 1.9342813113834067e+25) +
                                            ((double)CONCAT44(0x43300000,(int)lVar3) -
                                            4503599627370496.0))) + local_d8;
                local_e0 = (in_stack_00000040[(long)local_110] - dVar7) *
                           ((in_stack_00000040[(long)local_110] - dVar7) /
                           ((auVar12._8_8_ - 1.9342813113834067e+25) +
                           ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0))) +
                           local_e0;
              }
              if (local_a8 < local_d8 + local_e0) {
                *in_stack_00000048 = local_100;
                local_a8 = local_d8 + local_e0;
              }
            }
          }
        }
      }
    }
    else {
      local_120 = in_RSI;
      if (local_39 == 0) {
        for (; local_120 < in_RDX; local_120 = local_120 + 1) {
          lVar3 = *(long *)(in_stack_00000030 + *(long *)(in_RCX + local_120 * 8) * 8);
          xpy1((double *)(in_stack_00000020 + lVar3 * 8),(size_t *)(in_stack_00000028 + lVar3 * 8),
               *(long *)(in_stack_00000030 + 8 + *(long *)(in_RCX + local_120 * 8) * 8) - lVar3,
               in_stack_00000038);
          if (bVar2 == 0) {
            fVar18 = *(float *)(in_RDI + local_120 * 4);
            pfVar1 = (float *)(in_RDI + 4 + local_120 * 4);
            if ((fVar18 != *pfVar1) || (NAN(fVar18) || NAN(*pfVar1))) goto LAB_004c72c8;
          }
          else {
            fVar18 = *(float *)(in_RDI + *(long *)(in_RCX + local_120 * 8) * 4);
            pfVar1 = (float *)(in_RDI + *(long *)(in_RCX + 8 + local_120 * 8) * 4);
            if ((fVar18 != *pfVar1) || (NAN(fVar18) || NAN(*pfVar1))) {
LAB_004c72c8:
              local_d8 = 0.0;
              local_e0 = 0.0;
              lVar3 = (local_120 - in_RSI) + 1;
              auVar13._8_4_ = (int)((ulong)lVar3 >> 0x20);
              auVar13._0_8_ = lVar3;
              auVar13._12_4_ = 0x45300000;
              lVar4 = in_RDX - local_120;
              auVar14._8_4_ = (int)((ulong)lVar4 >> 0x20);
              auVar14._0_8_ = lVar4;
              auVar14._12_4_ = 0x45300000;
              for (local_128 = (unsigned_long *)0x0; local_128 < in_stack_00000018;
                  local_128 = (unsigned_long *)((long)local_128 + 1)) {
                dVar7 = in_stack_00000038[(long)local_128];
                local_d8 = dVar7 * (dVar7 / ((auVar13._8_8_ - 1.9342813113834067e+25) +
                                            ((double)CONCAT44(0x43300000,(int)lVar3) -
                                            4503599627370496.0))) + local_d8;
                local_e0 = (in_stack_00000040[(long)local_128] - dVar7) *
                           ((in_stack_00000040[(long)local_128] - dVar7) /
                           ((auVar14._8_8_ - 1.9342813113834067e+25) +
                           ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0))) +
                           local_e0;
              }
              if (local_a8 < local_d8 + local_e0) {
                *in_stack_00000048 = local_120;
                local_a8 = local_d8 + local_e0;
              }
            }
          }
        }
      }
      else {
        for (local_158 = in_RSI; local_158 < in_RDX; local_158 = local_158 + 1) {
          local_130 = (ulong *)(in_stack_00000028 +
                               *(long *)(in_stack_00000030 + *(long *)(in_RCX + local_158 * 8) * 8)
                               * 8);
          puVar5 = (ulong *)(in_stack_00000028 +
                            *(long *)(in_stack_00000030 + 8 + *(long *)(in_RCX + local_158 * 8) * 8)
                            * 8);
          if (local_130 != puVar5) {
            lVar3 = *(long *)(in_stack_00000030 + *(long *)(in_RCX + local_158 * 8) * 8);
            local_140 = in_R8;
            while (uVar19 = local_140 < in_R8 + (long)in_R9 && local_130 < puVar5,
                  local_140 < in_R8 + (long)in_R9 && local_130 < puVar5) {
              if (*local_130 == *local_140) {
                in_stack_fffffffffffffe18 = in_stack_00000020 + lVar3 * 8;
                dVar6 = std::distance<unsigned_long*>
                                  ((unsigned_long *)CONCAT17(uVar19,in_stack_fffffffffffffe30),
                                   (unsigned_long *)in_stack_fffffffffffffe28);
                dVar7 = *(double *)(in_stack_fffffffffffffe18 + dVar6 * 8);
                in_stack_fffffffffffffe28 = in_stack_00000038;
                dVar6 = std::distance<unsigned_long*>
                                  ((unsigned_long *)CONCAT17(uVar19,in_stack_fffffffffffffe30),
                                   (unsigned_long *)in_stack_00000038);
                in_stack_fffffffffffffe28[dVar6] = dVar7 + in_stack_fffffffffffffe28[dVar6];
                local_140 = local_140 + 1;
                local_130 = local_130 + 1;
              }
              else if (*local_140 < *local_130) {
                local_140 = std::lower_bound<unsigned_long*,unsigned_long>
                                      ((unsigned_long *)__first,__last,
                                       (unsigned_long *)CONCAT17(uVar19,in_stack_fffffffffffffe30));
              }
              else {
                local_130 = std::lower_bound<unsigned_long*,unsigned_long>
                                      ((unsigned_long *)__first,__last,
                                       (unsigned_long *)CONCAT17(uVar19,in_stack_fffffffffffffe30));
              }
            }
          }
          if (bVar2 == 0) {
            fVar18 = *(float *)(in_RDI + local_158 * 4);
            pfVar1 = (float *)(in_RDI + 4 + local_158 * 4);
            if ((fVar18 != *pfVar1) || (NAN(fVar18) || NAN(*pfVar1))) goto LAB_004c77b2;
          }
          else {
            fVar18 = *(float *)(in_RDI + *(long *)(in_RCX + local_158 * 8) * 4);
            pfVar1 = (float *)(in_RDI + *(long *)(in_RCX + 8 + local_158 * 8) * 4);
            if ((fVar18 != *pfVar1) || (NAN(fVar18) || NAN(*pfVar1))) {
LAB_004c77b2:
              local_d8 = 0.0;
              local_e0 = 0.0;
              lVar3 = (local_158 - in_RSI) + 1;
              auVar15._8_4_ = (int)((ulong)lVar3 >> 0x20);
              auVar15._0_8_ = lVar3;
              auVar15._12_4_ = 0x45300000;
              lVar4 = in_RDX - local_158;
              auVar16._8_4_ = (int)((ulong)lVar4 >> 0x20);
              auVar16._0_8_ = lVar4;
              auVar16._12_4_ = 0x45300000;
              for (local_160 = (unsigned_long *)0x0; local_160 < in_R9;
                  local_160 = (unsigned_long *)((long)local_160 + 1)) {
                dVar7 = in_stack_00000038[(long)local_160];
                local_d8 = dVar7 * (dVar7 / ((auVar15._8_8_ - 1.9342813113834067e+25) +
                                            ((double)CONCAT44(0x43300000,(int)lVar3) -
                                            4503599627370496.0))) + local_d8;
                local_e0 = (in_stack_00000040[(long)local_160] - dVar7) *
                           ((in_stack_00000040[(long)local_160] - dVar7) /
                           ((auVar16._8_8_ - 1.9342813113834067e+25) +
                           ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0))) +
                           local_e0;
              }
              if (local_a8 < local_d8 + local_e0) {
                *in_stack_00000048 = local_158;
                local_a8 = local_d8 + local_e0;
              }
            }
          }
        }
      }
    }
    if (-INFINITY < local_a8) {
      fVar18 = (float)((ulong)in_stack_fffffffffffffe18 >> 0x20);
      if (bVar2 == 0) {
        dVar7 = midpoint<float>(fVar18,(float)in_stack_fffffffffffffe18);
        *in_stack_00000050 = dVar7;
      }
      else {
        dVar7 = midpoint<float>(fVar18,(float)in_stack_fffffffffffffe18);
        *in_stack_00000050 = dVar7;
      }
      lVar3 = (in_RDX - in_RSI) + 1;
      local_8 = local_a8 / ((double)(float)(&DAT_006c0110)[lVar3 < 0] + (double)lVar3);
    }
    else {
      local_8 = local_a8;
    }
  }
  else {
    local_8 = -INFINITY;
  }
  return local_8;
}

Assistant:

double find_split_full_gain(real_t *restrict x, size_t st, size_t end, size_t *restrict ix_arr,
                            size_t *restrict cols_use, size_t ncols_use, bool force_cols_use,
                            double *restrict X_row_major, size_t ncols,
                            double *restrict Xr, size_t *restrict Xr_ind, size_t *restrict Xr_indptr,
                            double *restrict buffer_sum_left, double *restrict buffer_sum_tot,
                            size_t &restrict split_ix, double &restrict split_point,
                            bool x_uses_ix_arr)
{
    if (end <= st) return -HUGE_VAL;
    if (cols_use != NULL && ncols_use && (double)ncols_use / (double)ncols < 0.1)
        force_cols_use = true;

    memset(buffer_sum_tot, 0, (force_cols_use? ncols_use : ncols)*sizeof(double));
    if (Xr_indptr == NULL)
    {
        if (force_cols_use)
        {
            double *restrict ptr_row;
            for (size_t row = st; row <= end; row++)
            {
                ptr_row = X_row_major + ix_arr[row]*ncols;
                for (size_t col = 0; col < ncols_use; col++)
                    buffer_sum_tot[col] += ptr_row[cols_use[col]];
            }
        }

        else
        {
            for (size_t row = st; row <= end; row++)
                xpy1(X_row_major + ix_arr[row]*ncols, buffer_sum_tot, ncols);
        }
    }

    else
    {
        if (force_cols_use)
        {
            size_t *curr_begin;
            size_t *row_end;
            size_t *curr_col;
            double *restrict Xr_this;
            size_t *cols_end = cols_use + ncols_use;
            for (size_t row = st; row <= end; row++)
            {
                curr_begin = Xr_ind + Xr_indptr[ix_arr[row]];
                row_end = Xr_ind + Xr_indptr[ix_arr[row] + 1];
                if (curr_begin == row_end) continue;
                curr_col = cols_use;
                Xr_this = Xr + Xr_indptr[ix_arr[row]];
                
                while (curr_col < cols_end && curr_begin < row_end)
                {
                    if (*curr_begin == *curr_col)
                    {
                        buffer_sum_tot[std::distance(cols_use, curr_col)] += Xr_this[std::distance(curr_begin, row_end)];
                        curr_col++;
                        curr_begin++;
                    }

                    else
                    {
                        if (*curr_begin > *curr_col)
                            curr_col = std::lower_bound(curr_col, cols_end, *curr_begin);
                        else
                            curr_begin = std::lower_bound(curr_begin, row_end, *curr_col);
                    }
                }
            }
        }

        else
        {
            size_t ptr_this;
            for (size_t row = st; row <= end; row++)
            {
                ptr_this = Xr_indptr[ix_arr[row]];
                xpy1(Xr + ptr_this, Xr_ind + ptr_this, Xr_indptr[ix_arr[row]+1] - ptr_this, buffer_sum_tot);
            }
        }
    }

    double best_gain = -HUGE_VAL;
    double this_gain;
    double sl, sr;
    double dl, dr;
    double vleft, vright;
    memset(buffer_sum_left, 0, (force_cols_use? ncols_use : ncols)*sizeof(double));
    if (Xr_indptr == NULL)
    {
        if (!force_cols_use)
        {
            for (size_t row = st; row < end; row++)
            {
                xpy1(X_row_major + ix_arr[row]*ncols, buffer_sum_left, ncols);
                if (x_uses_ix_arr) {
                    if (unlikely(x[ix_arr[row]] == x[ix_arr[row+1]])) continue;
                }
                else {
                    if (unlikely(x[row] == x[row+1])) continue;
                }

                vleft = 0;
                vright = 0;
                dl = (double)(row-st+1);
                dr = (double)(end-row);
                for (size_t col = 0; col < ncols; col++)
                {
                    sl = buffer_sum_left[col];
                    vleft += sl * (sl / dl);
                    sr = buffer_sum_tot[col] - sl;
                    vright += sr * (sr / dr);
                }

                this_gain = vleft + vright;
                if (this_gain > best_gain)
                {
                    best_gain = this_gain;
                    split_ix = row;
                }
            }
        }

        else
        {
            double *restrict ptr_row;
            for (size_t row = st; row < end; row++)
            {
                ptr_row = X_row_major + ix_arr[row]*ncols;
                for (size_t col = 0; col < ncols_use; col++)
                    buffer_sum_left[col] += ptr_row[cols_use[col]];
                if (x_uses_ix_arr) {
                    if (unlikely(x[ix_arr[row]] == x[ix_arr[row+1]])) continue;
                }
                else {
                    if (unlikely(x[row] == x[row+1])) continue;
                }

                vleft = 0;
                vright = 0;
                dl = (double)(row-st+1);
                dr = (double)(end-row);
                for (size_t col = 0; col < ncols_use; col++)
                {
                    sl = buffer_sum_left[col];
                    vleft += sl * (sl / dl);
                    sr = buffer_sum_tot[col] - sl;
                    vright += sr * (sr / dr);
                }

                this_gain = vleft + vright;
                if (this_gain > best_gain)
                {
                    best_gain = this_gain;
                    split_ix = row;
                }
            }
        }
    }

    else
    {
        if (!force_cols_use)
        {
            size_t ptr_this;
            for (size_t row = st; row < end; row++)
            {
                ptr_this = Xr_indptr[ix_arr[row]];
                xpy1(Xr + ptr_this, Xr_ind + ptr_this, Xr_indptr[ix_arr[row]+1] - ptr_this, buffer_sum_left);
                if (x_uses_ix_arr) {
                    if (unlikely(x[ix_arr[row]] == x[ix_arr[row+1]])) continue;
                }
                else {
                    if (unlikely(x[row] == x[row+1])) continue;
                }

                vleft = 0;
                vright = 0;
                dl = (double)(row-st+1);
                dr = (double)(end-row);
                for (size_t col = 0; col < ncols; col++)
                {
                    sl = buffer_sum_left[col];
                    vleft += sl * (sl / dl);
                    sr = buffer_sum_tot[col] - sl;
                    vright += sr * (sr / dr);
                }

                this_gain = vleft + vright;
                if (this_gain > best_gain)
                {
                    best_gain = this_gain;
                    split_ix = row;
                }
            }
        }

        else
        {
            size_t *curr_begin;
            size_t *row_end;
            size_t *curr_col;
            double *restrict Xr_this;
            size_t *cols_end = cols_use + ncols_use;
            for (size_t row = st; row < end; row++)
            {
                curr_begin = Xr_ind + Xr_indptr[ix_arr[row]];
                row_end = Xr_ind + Xr_indptr[ix_arr[row] + 1];
                if (curr_begin == row_end) goto skip_sum;
                curr_col = cols_use;
                Xr_this = Xr + Xr_indptr[ix_arr[row]];
                while (curr_col < cols_end && curr_begin < row_end)
                {
                    if (*curr_begin == *curr_col)
                    {
                        buffer_sum_left[std::distance(cols_use, curr_col)] += Xr_this[std::distance(curr_begin, row_end)];
                        curr_col++;
                        curr_begin++;
                    }

                    else
                    {
                        if (*curr_begin > *curr_col)
                            curr_col = std::lower_bound(curr_col, cols_end, *curr_begin);
                        else
                            curr_begin = std::lower_bound(curr_begin, row_end, *curr_col);
                    }
                }

                skip_sum:
                if (x_uses_ix_arr) {
                    if (unlikely(x[ix_arr[row]] == x[ix_arr[row+1]])) continue;
                }
                else {
                    if (unlikely(x[row] == x[row+1])) continue;
                }

                vleft = 0;
                vright = 0;
                dl = (double)(row-st+1);
                dr = (double)(end-row);
                for (size_t col = 0; col < ncols_use; col++)
                {
                    sl = buffer_sum_left[col];
                    vleft += sl * (sl / dl);
                    sr = buffer_sum_tot[col] - sl;
                    vright += sr * (sr / dr);
                }

                this_gain = vleft + vright;
                if (this_gain > best_gain)
                {
                    best_gain = this_gain;
                    split_ix = row;
                }
            }
        }
    }

    if (best_gain <= -HUGE_VAL) return best_gain;

    if (x_uses_ix_arr)
        split_point = midpoint(x[ix_arr[split_ix]], x[ix_arr[split_ix+1]]);
    else
        split_point = midpoint(x[split_ix], x[split_ix+1]);
    return best_gain / (ldouble_safe)(end - st + 1);
}